

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalParameterData.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::FundamentalParameterData::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,FundamentalParameterData *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"Fundamental Parameter Data:");
  poVar1 = std::operator<<(poVar1,"\n\tFrequency:                  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Freq);
  poVar1 = std::operator<<(poVar1,"\n\tFrequency Range:            ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32FreqRange);
  poVar1 = std::operator<<(poVar1,"\n\tEffective Radiated Power:   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32EffectiveRadiatedPower);
  poVar1 = std::operator<<(poVar1,"\n\tPulse Repetition Frequency: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32PulseRepetitionFreq);
  poVar1 = std::operator<<(poVar1,"\n\tPulse Width:                ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32PulseWidth);
  poVar1 = std::operator<<(poVar1,"\n\tBeam Azimuth Center:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32BeamAzimuthCenter);
  poVar1 = std::operator<<(poVar1,"\n\tBeam Azimuth Sweep:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32BeamAzimuthSweep);
  poVar1 = std::operator<<(poVar1,"\n\tBeam Elevation Center:      ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32BeamElevationCenter);
  poVar1 = std::operator<<(poVar1,"\n\tBeam Elevation Sweep:       ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32BeamElevationSweep);
  poVar1 = std::operator<<(poVar1,"\n\tBeam Sweep Sync:            ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32BeamSweepSync);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

KString FundamentalParameterData::GetAsString() const
{
    KStringStream ss;

    ss << "Fundamental Parameter Data:"
       << "\n\tFrequency:                  " << m_f32Freq
       << "\n\tFrequency Range:            " << m_f32FreqRange
       << "\n\tEffective Radiated Power:   " << m_f32EffectiveRadiatedPower
       << "\n\tPulse Repetition Frequency: " << m_f32PulseRepetitionFreq
       << "\n\tPulse Width:                " << m_f32PulseWidth
       << "\n\tBeam Azimuth Center:        " << m_f32BeamAzimuthCenter
       << "\n\tBeam Azimuth Sweep:         " << m_f32BeamAzimuthSweep
       << "\n\tBeam Elevation Center:      " << m_f32BeamElevationCenter
       << "\n\tBeam Elevation Sweep:       " << m_f32BeamElevationSweep
       << "\n\tBeam Sweep Sync:            " << m_f32BeamSweepSync
       << "\n";

    return ss.str();
}